

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_os_utimes(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  char *__file;
  ulong uVar3;
  int64_t iVar4;
  JSValue JVar5;
  int64_t mtime;
  int64_t atime;
  timeval times [2];
  
  iVar1 = JS_ToInt64(ctx,&atime,argv[1]);
  iVar4 = 6;
  if (iVar1 == 0) {
    iVar1 = JS_ToInt64(ctx,&mtime,argv[2]);
    if (iVar1 == 0) {
      __file = JS_ToCString(ctx,*argv);
      if (__file != (char *)0x0) {
        times[0].tv_sec = (ulong)atime / 1000;
        times[0].tv_usec = ((ulong)atime % 1000) * 1000;
        times[1].tv_sec = (ulong)mtime / 1000;
        iVar4 = 0;
        times[1].tv_usec = ((ulong)mtime % 1000) * 1000;
        iVar1 = utimes(__file,(timeval *)times);
        uVar3 = js_get_errno((long)iVar1);
        JS_FreeCString(ctx,__file);
        JVar2.ptr = (void *)(uVar3 & 0xffffffff);
        goto LAB_001113db;
      }
    }
  }
  JVar2.float64 = 0.0;
LAB_001113db:
  JVar5.tag = iVar4;
  JVar5.u.float64 = JVar2.float64;
  return JVar5;
}

Assistant:

static JSValue js_os_utimes(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv)
{
    const char *path;
    int64_t atime, mtime;
    int ret;
    
    if (JS_ToInt64(ctx, &atime, argv[1]))
        return JS_EXCEPTION;
    if (JS_ToInt64(ctx, &mtime, argv[2]))
        return JS_EXCEPTION;
    path = JS_ToCString(ctx, argv[0]);
    if (!path)
        return JS_EXCEPTION;
#if defined(_WIN32)
    {
        struct _utimbuf times;
        times.actime = atime / 1000;
        times.modtime = mtime / 1000;
        ret = js_get_errno(_utime(path, &times));
    }
#else
    {
        struct timeval times[2];
        ms_to_timeval(&times[0], atime);
        ms_to_timeval(&times[1], mtime);
        ret = js_get_errno(utimes(path, times));
    }
#endif
    JS_FreeCString(ctx, path);
    return JS_NewInt32(ctx, ret);
}